

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O0

void __thiscall Assimp::DefaultLogger::DefaultLogger(DefaultLogger *this,LogSeverity severity)

{
  LogSeverity severity_local;
  DefaultLogger *this_local;
  
  Logger::Logger(&this->super_Logger,severity);
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__DefaultLogger_0037a150;
  std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::vector
            (&this->m_StreamArray);
  this->noRepeatMsg = false;
  this->lastLen = 0;
  this->lastMsg[0] = '\0';
  return;
}

Assistant:

DefaultLogger::DefaultLogger(LogSeverity severity)
    :   Logger  ( severity )
    ,   noRepeatMsg (false)
    ,   lastLen( 0 ) {
    lastMsg[0] = '\0';
}